

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

vec3 polyscope::view::bufferCoordsToWorldRay(vec2 screenCoords)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vec<3,_float,_(glm::qualifier)0> vVar10;
  vec3 vVar11;
  vec3 screenPos3;
  mat4 view;
  mat4 proj;
  mat4 invViewMat;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_134;
  float local_130;
  undefined4 local_12c;
  vec<4,_float,_(glm::qualifier)0> local_128;
  mat<4,_4,_float,_(glm::qualifier)0> local_118;
  mat<4,_4,_float,_(glm::qualifier)0> local_d8;
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  undefined8 local_28;
  float fStack_20;
  undefined4 uStack_1c;
  
  local_118.value[0]._0_8_ = viewMat;
  local_118.value[0]._8_8_ = _DAT_005fc68c;
  local_118.value[1]._0_8_ = DAT_005fc694;
  local_118.value[1]._8_8_ = _DAT_005fc69c;
  local_118.value[2]._0_8_ = DAT_005fc6a4;
  local_118.value[2]._8_8_ = DAT_005fc6ac;
  local_118.value[3]._0_8_ = DAT_005fc6b4;
  local_118.value[3]._8_8_ = DAT_005fc6bc;
  getCameraPerspectiveMatrix();
  local_128.field_2.z = (float)bufferWidth;
  auVar8._8_8_ = in_XMM0_Qb;
  auVar8._0_8_ = screenCoords;
  local_128.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_128.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  auVar8 = vmovshdup_avx(auVar8);
  local_134 = screenCoords.field_0;
  local_128.field_3.w = (float)bufferHeight;
  local_130 = local_128.field_3.w - auVar8._0_4_;
  uVar6 = 0;
  local_12c = 0;
  vVar10 = glm::unProjectNO<float,float,(glm::qualifier)0>
                     ((vec<3,_float,_(glm::qualifier)0> *)&local_134,&local_118,&local_98,&local_128
                     );
  local_d8.value[0].field_0 = viewMat._0_4_;
  local_d8.value[0].field_1 = viewMat._4_4_;
  local_d8.value[0].field_2 = DAT_005fc68c;
  local_d8.value[0].field_3 = _DAT_005fc690;
  local_d8.value[1].field_0 = DAT_005fc694._0_4_;
  local_d8.value[1].field_1 = DAT_005fc694._4_4_;
  local_d8.value[1].field_2 = DAT_005fc69c;
  local_d8.value[1].field_3 = _DAT_005fc6a0;
  local_d8.value[2].field_0 = DAT_005fc6a4._0_4_;
  local_d8.value[2].field_1 = DAT_005fc6a4._4_4_;
  local_d8.value[2].field_2 = DAT_005fc6ac._0_4_;
  local_d8.value[2].field_3 = DAT_005fc6ac._4_4_;
  local_d8.value[3].field_0 = DAT_005fc6b4._0_4_;
  local_d8.value[3].field_1 = DAT_005fc6b4._4_4_;
  local_d8.value[3].field_2 = DAT_005fc6bc._0_4_;
  local_d8.value[3].field_3 = DAT_005fc6bc._4_4_;
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_d8);
  fVar3 = vVar10.field_2.z - fStack_20;
  auVar4._8_8_ = uVar6;
  auVar4._0_8_ = vVar10._0_8_;
  auVar5._8_4_ = fStack_20;
  auVar5._0_8_ = local_28;
  auVar5._12_4_ = uStack_1c;
  auVar8 = vsubps_avx(auVar4,auVar5);
  fVar1 = auVar8._0_4_;
  auVar9._0_4_ = fVar1 * fVar1;
  fVar2 = auVar8._4_4_;
  auVar9._4_4_ = fVar2 * fVar2;
  auVar9._8_4_ = auVar8._8_4_ * auVar8._8_4_;
  auVar9._12_4_ = auVar8._12_4_ * auVar8._12_4_;
  auVar8 = vhaddps_avx(auVar9,auVar9);
  auVar8 = ZEXT416((uint)(fVar3 * fVar3 + auVar8._0_4_));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  fVar7 = 1.0 / auVar8._0_4_;
  vVar11.field_0 = fVar1 * fVar7;
  vVar11.field_1 = fVar2 * fVar7;
  vVar11.field_2.z = fVar3 * fVar7;
  return vVar11;
}

Assistant:

glm::vec3 bufferCoordsToWorldRay(glm::vec2 screenCoords) {

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::vec4 viewport = {0., 0., view::bufferWidth, view::bufferHeight};

  glm::vec3 screenPos3{screenCoords.x, view::bufferHeight - screenCoords.y, 0.};
  glm::vec3 worldPos = glm::unProject(screenPos3, view, proj, viewport);
  glm::vec3 worldRayDir = glm::normalize(glm::vec3(worldPos) - getCameraWorldPosition());

  return worldRayDir;
}